

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPrint.c
# Opt level: O2

void Fxu_MatrixPrintDivisorProfile(FILE *pFile,Fxu_Matrix *p)

{
  int *piVar1;
  uint uVar2;
  Fxu_Double *pFVar3;
  int iVar4;
  void *__ptr;
  ulong uVar5;
  Fxu_ListDouble *pFVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  iVar4 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
  __ptr = calloc(1,(long)iVar4 * 4 + 4);
  uVar5 = 0;
  uVar8 = (ulong)(uint)p->nTableSize;
  if (p->nTableSize < 1) {
    uVar8 = uVar5;
  }
  uVar7 = 0;
  uVar9 = 0;
  do {
    if (uVar5 == uVar8) {
      fwrite("The double divisors profile:\n",0x1d,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"Weight  < -1 divisors = %6d\n",(ulong)uVar9);
      fprintf((FILE *)pFile,"Weight    -1 divisors = %6d\n",(ulong)uVar7);
      for (uVar8 = 0; (long)uVar8 <= (long)iVar4; uVar8 = uVar8 + 1) {
        if (*(int *)((long)__ptr + uVar8 * 4) != 0) {
          fprintf((FILE *)pFile,"Weight   %3d divisors = %6d\n",uVar8 & 0xffffffff);
        }
      }
      fwrite("End of divisor profile printout\n",0x20,1,(FILE *)pFile);
      free(__ptr);
      return;
    }
    pFVar6 = p->pTable + uVar5;
    while (pFVar3 = pFVar6->pHead, pFVar3 != (Fxu_Double *)0x0) {
      uVar2 = pFVar3->Weight;
      if (iVar4 < (int)uVar2) {
        __assert_fail("pDiv->Weight <= WeightMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPrint.c"
                      ,0xb0,"void Fxu_MatrixPrintDivisorProfile(FILE *, Fxu_Matrix *)");
      }
      if (uVar2 == 0xffffffff) {
        uVar7 = uVar7 + 1;
      }
      else if ((int)uVar2 < 0) {
        uVar9 = uVar9 + 1;
      }
      else {
        piVar1 = (int *)((long)__ptr + (ulong)uVar2 * 4);
        *piVar1 = *piVar1 + 1;
      }
      pFVar6 = (Fxu_ListDouble *)&pFVar3->pNext;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void Fxu_MatrixPrintDivisorProfile( FILE * pFile, Fxu_Matrix * p )
{
    Fxu_Double * pDiv;
    int WeightMax;
    int * pProfile;
    int Counter1; // the number of -1 weight
    int CounterL; // the number of less than -1 weight
    int i;

    WeightMax = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );
    pProfile = ABC_ALLOC( int, (WeightMax + 1) );
    memset( pProfile, 0, sizeof(int) * (WeightMax + 1) );

    Counter1 = 0;
    CounterL = 0;
	Fxu_MatrixForEachDouble( p, pDiv, i )
    {
        assert( pDiv->Weight <= WeightMax );
        if ( pDiv->Weight == -1 )
            Counter1++;
        else if ( pDiv->Weight < 0 )
            CounterL++;
        else
            pProfile[ pDiv->Weight ]++;
    }

	fprintf( pFile, "The double divisors profile:\n" );
	fprintf( pFile, "Weight  < -1 divisors = %6d\n", CounterL );
	fprintf( pFile, "Weight    -1 divisors = %6d\n", Counter1 );
    for ( i = 0; i <= WeightMax; i++ )
        if ( pProfile[i] )
	        fprintf( pFile, "Weight   %3d divisors = %6d\n", i, pProfile[i] );
	fprintf( pFile, "End of divisor profile printout\n" );
    ABC_FREE( pProfile );
}